

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O1

bool __thiscall
MipsParser::parseRspVectorElement(MipsParser *this,Parser *parser,MipsRegisterValue *dest)

{
  TokenType TVar1;
  pointer pcVar2;
  char *__s;
  bool bVar3;
  int iVar4;
  Token *pTVar5;
  MipsParser *this_00;
  long *plVar6;
  long *plVar7;
  long lVar8;
  long *plVar9;
  string stringValue;
  allocator<char> local_99;
  long *local_98;
  long lStack_90;
  long local_88 [3];
  string local_70;
  Identifier local_50;
  
  dest->type = RspVectorElement;
  pTVar5 = Tokenizer::peekToken
                     ((parser->entries).
                      super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
  if (pTVar5->type != LBrack) {
    dest->num = 0;
    local_88[1] = 0;
    lStack_90 = 0;
    local_88[0] = 0;
    local_98 = local_88;
    std::__cxx11::string::operator=((string *)&dest->name,(string *)&local_98);
    if (local_98 != local_88) {
      operator_delete(local_98,local_88[0] + 1);
    }
    return true;
  }
  this_00 = (MipsParser *)
            (parser->entries).
            super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].tokenizer;
  Tokenizer::eatTokens((Tokenizer *)this_00,1);
  bVar3 = parseRegisterNumber(this_00,parser,dest,0x10);
  pTVar5 = Tokenizer::nextToken
                     ((parser->entries).
                      super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
  TVar1 = pTVar5->type;
  if (bVar3) {
    return TVar1 == RBrack;
  }
  if ((TVar1 != NumberString) && (TVar1 != Integer)) {
    return false;
  }
  local_98 = local_88;
  pcVar2 = (pTVar5->originalText)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar2,pcVar2 + (pTVar5->originalText)._M_string_length);
  plVar9 = (long *)((long)local_98 + lStack_90);
  plVar6 = local_98;
  if (0 < lStack_90 >> 2) {
    lVar8 = (lStack_90 >> 2) + 1;
    plVar6 = (long *)((long)local_98 + 3);
    do {
      plVar7 = plVar6;
      iVar4 = iswupper((int)*(char *)((long)plVar7 + -3));
      if (iVar4 != 0) {
        plVar7 = (long *)((long)plVar7 + -3);
        goto LAB_001678a8;
      }
      iVar4 = iswupper((int)*(char *)((long)plVar7 + -2));
      if (iVar4 != 0) {
        plVar7 = (long *)((long)plVar7 + -2);
        goto LAB_001678a8;
      }
      iVar4 = iswupper((int)*(char *)((long)plVar7 + -1));
      if (iVar4 != 0) {
        plVar7 = (long *)((long)plVar7 + -1);
        goto LAB_001678a8;
      }
      iVar4 = iswupper((int)(char)*plVar7);
      if (iVar4 != 0) goto LAB_001678a8;
      lVar8 = lVar8 + -1;
      plVar6 = (long *)((long)plVar7 + 4);
    } while (1 < lVar8);
    plVar6 = (long *)((long)plVar7 + 1);
  }
  lVar8 = (long)plVar9 - (long)plVar6;
  if (lVar8 != 1) {
    if (lVar8 != 2) {
      plVar7 = plVar9;
      if ((lVar8 != 3) || (iVar4 = iswupper((int)(char)*plVar6), plVar7 = plVar6, iVar4 != 0))
      goto LAB_001678a8;
      plVar6 = (long *)((long)plVar6 + 1);
    }
    iVar4 = iswupper((int)(char)*plVar6);
    plVar7 = plVar6;
    if (iVar4 != 0) goto LAB_001678a8;
    plVar6 = (long *)((long)plVar6 + 1);
  }
  iVar4 = iswupper((int)(char)*plVar6);
  plVar7 = plVar6;
  if (iVar4 == 0) {
    plVar7 = plVar9;
  }
LAB_001678a8:
  plVar6 = local_98;
  if ((plVar7 != plVar9) && (lStack_90 != 0)) {
    lVar8 = 0;
    do {
      iVar4 = tolower((int)*(char *)((long)plVar6 + lVar8));
      *(char *)((long)plVar6 + lVar8) = (char)iVar4;
      lVar8 = lVar8 + 1;
    } while (lStack_90 != lVar8);
  }
  lVar8 = 8;
  do {
    __s = *(char **)((long)&mipsRspVectorRegisters[0x29].num + lVar8);
    iVar4 = std::__cxx11::string::compare((char *)&local_98);
    if (iVar4 == 0) {
      dest->num = *(int *)((long)&parseRspVectorElement::rspElementNames[0].name + lVar8);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,__s,&local_99);
      Identifier::Identifier(&local_50,&local_70);
      std::__cxx11::string::operator=((string *)&dest->name,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._name._M_dataplus._M_p != &local_50._name.field_2) {
        operator_delete(local_50._name._M_dataplus._M_p,
                        local_50._name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      pTVar5 = Tokenizer::nextToken
                         ((parser->entries).
                          super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                          _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
      bVar3 = pTVar5->type == RBrack;
      goto LAB_00167996;
    }
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x168);
  bVar3 = false;
LAB_00167996:
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  return bVar3;
}

Assistant:

bool MipsParser::parseRspVectorElement(Parser& parser, MipsRegisterValue& dest)
{
	dest.type = MipsRegisterType::RspVectorElement;

	if (parser.peekToken().type == TokenType::LBrack)
	{
		static const MipsRegisterDescriptor rspElementNames[] = {
			{ "0q", 2 },  { "1q", 3 }, { "0h", 4 },  { "1h", 5 },
			{ "2h", 6 },  { "3h", 7 }, { "0w", 8 },  { "0", 8 },
			{ "1w", 9 },  { "1", 9 },  { "2w", 10 }, { "2", 10 },
			{ "3w", 11 }, { "3", 11 }, { "4w", 12 }, { "4", 12 },
			{ "5w", 13 }, { "5", 13 }, { "6w", 14 }, { "6", 14 },
			{ "7w", 15 }, { "7", 15 },
		};

		parser.eatToken();

		if (parseRegisterNumber(parser, dest, 16))
			return parser.nextToken().type == TokenType::RBrack;

		const Token& token = parser.nextToken();

		if (token.type != TokenType::Integer && token.type != TokenType::NumberString)
			return false;

		//ignore the numerical values, just use the original text as an identifier
		std::string stringValue = token.getOriginalText();
		if (std::any_of(stringValue.begin(), stringValue.end(), iswupper))
		{
			std::transform(stringValue.begin(), stringValue.end(), stringValue.begin(), tolower);
		}

		for (size_t i = 0; i < std::size(rspElementNames); i++)
		{
			if (stringValue == rspElementNames[i].name)
			{
				dest.num = rspElementNames[i].num;
				dest.name = Identifier(rspElementNames[i].name);

				return parser.nextToken().type == TokenType::RBrack;
			}
		}

		return false;
	}

	dest.num = 0;
	dest.name = Identifier();

	return true;

}